

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2FDiv<double>
          (OptimizeInstructions *this,Binary *binary,double c)

{
  Const *pCVar1;
  Literal local_40;
  double local_28;
  double invDivisor;
  double c_local;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  local_28 = 1.0 / c;
  binary->op = MulFloat64;
  invDivisor = c;
  c_local = (double)binary;
  binary_local = (Binary *)this;
  wasm::Literal::Literal(&local_40,local_28);
  pCVar1 = Expression::cast<wasm::Const>(*(Expression **)((long)c_local + 0x20));
  wasm::Literal::operator=(&pCVar1->value,&local_40);
  wasm::Literal::~Literal(&local_40);
  return (Expression *)c_local;
}

Assistant:

Expression* optimizePowerOf2FDiv(Binary* binary, T c) {
    //
    // x / C_pot    =>   x * (C_pot ^ -1)
    //
    // Explanation:
    // Floating point numbers are represented as:
    //    ((-1) ^ sign) * (2 ^ (exp - bias)) * (1 + significand)
    //
    // If we have power of two numbers, then the mantissa (significand)
    // is all zeros. Let's focus on the exponent, ignoring the sign part:
    //    (2 ^ (exp - bias))
    //
    // and for inverted power of two floating point:
    //     1.0 / (2 ^ (exp - bias))   ->   2 ^ -(exp - bias)
    //
    // So inversion of C_pot is valid because it changes only the sign
    // of the exponent part and doesn't touch the significand part,
    // which remains the same (zeros).
    static_assert(std::is_same<T, float>::value ||
                    std::is_same<T, double>::value,
                  "type mismatch");
    double invDivisor = 1.0 / (double)c;
    binary->op = std::is_same<T, float>::value ? MulFloat32 : MulFloat64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(invDivisor));
    return binary;
  }